

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_peobj.c
# Opt level: O1

void emit_peobj_sym_sect(BuildCtx *ctx,PEsection *pesect,int sect)

{
  PEsymaux aux;
  PEsym sym;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_38;
  undefined4 local_30;
  short local_2c;
  undefined4 local_2a;
  
  if (strtab != (char *)0x0) {
    local_38 = *(undefined8 *)pesect[(uint)sect].name;
    local_30 = 0;
    local_2c = (short)sect + 1;
    local_2a = 0x1030000;
    owrite(ctx,&local_38,0x12);
    local_48 = 0;
    uStack_50 = 0;
    local_58 = (ulong)CONCAT24(pesect[(uint)sect].nreloc,pesect[(uint)sect].size);
    owrite(ctx,&local_58,0x12);
  }
  return;
}

Assistant:

static void emit_peobj_sym_sect(BuildCtx *ctx, PEsection *pesect, int sect)
{
  PEsym sym;
  PEsymaux aux;
  if (!strtab) return;  /* Pass 1: no output. */
  memcpy(sym.n.name, pesect[sect].name, 8);
  sym.value = 0;
  sym.sect = (int16_t)(sect+1);  /* 1-based section number. */
  sym.type = PEOBJ_TYPE_NULL;
  sym.scl = PEOBJ_SCL_STATIC;
  sym.naux = 1;
  owrite(ctx, &sym, PEOBJ_SYM_SIZE);
  memset(&aux, 0, sizeof(PEsymaux));
  aux.size = pesect[sect].size;
  aux.nreloc = pesect[sect].nreloc;
  owrite(ctx, &aux, PEOBJ_SYM_SIZE);
}